

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpkyt(fitsfile *fptr,char *keyname,long intval,double fraction,char *comm,int *status)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *cptr;
  char fstring [71];
  char local_e8 [8];
  char card [81];
  char local_88 [8];
  char valstring [71];
  int *status_local;
  char *comm_local;
  double fraction_local;
  long intval_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    unique0x10000149 = status;
    if ((1.0 < fraction) || (fraction < 0.0)) {
      ffpmsg("fraction must be between 0. and 1. (ffpkyt)");
      *stack0xffffffffffffffc0 = 0x192;
      fptr_local._4_4_ = 0x192;
    }
    else {
      ffi2c(intval,local_88,status);
      ffd2f(fraction,0x10,(char *)&cptr,stack0xffffffffffffffc0);
      __s = strchr((char *)&cptr,0x2e);
      sVar1 = strlen(local_88);
      sVar2 = strlen(__s);
      if (sVar1 + sVar2 < 0x47) {
        strcat(local_88,__s);
        ffmkky(keyname,local_88,comm,local_e8,stack0xffffffffffffffc0);
        ffprec(fptr,local_e8,stack0xffffffffffffffc0);
        fptr_local._4_4_ = *stack0xffffffffffffffc0;
      }
      else {
        ffpmsg("converted numerical string too long");
        *stack0xffffffffffffffc0 = 0x192;
        fptr_local._4_4_ = 0x192;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpkyt( fitsfile *fptr,      /* I - FITS file pointer        */
            const char  *keyname,/* I - name of keyword to write */
            long  intval,        /* I - integer part of value    */
            double fraction,     /* I - fractional part of value */
            const char  *comm,   /* I - keyword comment          */
            int   *status)       /* IO - error status            */
/*
  Write (put) a 'triple' precision keyword where the integer and
  fractional parts of the value are passed in separate parameters to
  increase the total amount of numerical precision.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];
    char fstring[FLEN_VALUE], *cptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (fraction > 1. || fraction < 0.)
    {
        ffpmsg("fraction must be between 0. and 1. (ffpkyt)");
        return(*status = BAD_F2C);
    }

    ffi2c(intval, valstring, status);  /* convert integer to string */
    ffd2f(fraction, 16, fstring, status);  /* convert to 16 decimal string */

    cptr = strchr(fstring, '.');    /* find the decimal point */
    if (strlen(valstring)+strlen(cptr) > FLEN_VALUE-1)
    {
       ffpmsg("converted numerical string too long");
       return(*status=BAD_F2C);
    }
    strcat(valstring, cptr);    /* append the fraction to the integer */

    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}